

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_ConstAcc.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_ConstAcc::ChFunction_ConstAcc
          (ChFunction_ConstAcc *this,double m_h,double m_av,double m_aw,double m_end)

{
  undefined1 auVar1 [16];
  undefined8 in_XMM3_Qb;
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_01190478;
  this->h = m_h;
  auVar1._8_8_ = in_XMM3_Qb;
  auVar1._0_8_ = m_end;
  auVar1 = vmaxsd_avx(ZEXT816(0),auVar1);
  this->end = auVar1._0_8_;
  Set_avw(this,m_av,m_aw);
  return;
}

Assistant:

ChFunction_ConstAcc::ChFunction_ConstAcc(double m_h, double m_av, double m_aw, double m_end) : h(m_h) {
    Set_end(m_end);
    Set_avw(m_av, m_aw);
}